

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

optional<UniValue> * InterpretValue(KeyInfo *key,string *value,uint flags,string *error)

{
  long lVar1;
  bool bVar2;
  uint in_ECX;
  long in_RDX;
  optional<UniValue> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000098;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  char *__t;
  optional<UniValue> *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  byte bVar4;
  undefined1 in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  LogFlags in_stack_ffffffffffffff40;
  int source_line;
  allocator<char> local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  ConstevalFormatString<2U> in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffff90;
  string_view in_stack_ffffffffffffffa0;
  
  source_line = (int)((ulong)in_R8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = in_RDI;
  if ((*(byte *)((long)&(in_RSI->super__Optional_base<UniValue,_false,_false>)._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload + 0x40) & 1) == 0) {
    if ((in_RDX == 0) && ((in_ECX & 0x40) != 0)) {
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((char *)in_RDI,in_RDI,in_stack_ffffffffffffff08);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffff38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      std::optional<UniValue>::optional((optional<UniValue> *)in_RDI);
    }
    else {
      bVar4 = 0;
      if (in_RDX == 0) {
        std::allocator<char>::allocator();
        bVar4 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
                   (allocator<char> *)in_RDI);
        pbVar3 = in_RDI;
      }
      else {
        std::__cxx11::string::string(in_stack_ffffffffffffff20,in_RDI);
        pbVar3 = in_RDI;
      }
      std::optional<UniValue>::
      optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if ((bVar4 & 1) != 0) {
        std::allocator<char>::~allocator(&local_8b);
      }
    }
  }
  else if ((in_ECX & 0x20) == 0) {
    if ((in_RDX == 0) || (bVar2 = InterpretBool(in_stack_fffffffffffffef0), pbVar3 = in_RDI, bVar2))
    {
      local_8a = 0;
      std::optional<UniValue>::optional<bool,_true>
                (in_stack_fffffffffffffee8,(bool *)in_stack_fffffffffffffee0);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
      __t = "Warning: parsed potentially confusing double-negative -%s=%s\n";
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90,source_line,
                 in_stack_ffffffffffffff40,(Level)value,in_stack_ffffffffffffff88,in_stack_00000090,
                 in_stack_00000098);
      local_89 = 1;
      std::optional<UniValue>::optional<bool,_true>(in_RSI,(bool *)__t);
      pbVar3 = in_RDI;
    }
  }
  else {
    tinyformat::format<std::__cxx11::string>
              ((char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::optional<UniValue>::optional((optional<UniValue> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (optional<UniValue> *)pbVar3;
}

Assistant:

std::optional<common::SettingsValue> InterpretValue(const KeyInfo& key, const std::string* value,
                                                  unsigned int flags, std::string& error)
{
    // Return negated settings as false values.
    if (key.negated) {
        if (flags & ArgsManager::DISALLOW_NEGATION) {
            error = strprintf("Negating of -%s is meaningless and therefore forbidden", key.name);
            return std::nullopt;
        }
        // Double negatives like -nofoo=0 are supported (but discouraged)
        if (value && !InterpretBool(*value)) {
            LogPrintf("Warning: parsed potentially confusing double-negative -%s=%s\n", key.name, *value);
            return true;
        }
        return false;
    }
    if (!value && (flags & ArgsManager::DISALLOW_ELISION)) {
        error = strprintf("Can not set -%s with no value. Please specify value with -%s=value.", key.name, key.name);
        return std::nullopt;
    }
    return value ? *value : "";
}